

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.h
# Opt level: O0

bool __thiscall tupleCompare::operator()(tupleCompare *this,Tuple *A,Tuple *B)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  int local_34;
  int i;
  int lB;
  int lA;
  Tuple *B_local;
  Tuple *A_local;
  tupleCompare *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&A->data);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&B->data);
  local_34 = 0;
  while( true ) {
    if ((int)sVar2 <= local_34) {
      return false;
    }
    if ((int)sVar3 <= local_34) {
      return false;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&A->data,(long)local_34);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&B->data,(long)local_34);
    bVar1 = std::operator<(pvVar4,pvVar5);
    if (bVar1) {
      return true;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&A->data,(long)local_34);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&B->data,(long)local_34);
    bVar1 = std::operator>(pvVar4,pvVar5);
    if (bVar1) break;
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

bool operator()(const Tuple& A, const Tuple& B)
 {
//   cout << "Called compare" << endl;
   int lA = A.data.size();
   int lB = B.data.size();
   for (int i = 0; i < lA; i++)
   {
    // cout << lB << "comparing " << A[i] << " to " << B[i] << endl;
     if (i >= lB) return false;
     if (A.data[i] < B.data[i]) return true;
     else if (A.data[i] > B.data[i]) return false;
   }
   return false;
 }